

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execLink<(moira::Instr)68,(moira::Mode)12,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 *puVar1;
  u16 ird;
  uint uVar2;
  u16 sr;
  u32 uVar3;
  ulong uVar4;
  AEStackFrame frame;
  
  ird = (this->queue).ird;
  uVar2 = (this->reg).field_3.field_0.a[7];
  addr = uVar2 - 4;
  uVar3 = readI<(moira::Size)2>(this);
  uVar4 = (ulong)(opcode & 7);
  if ((uVar2 & 1) == 0) {
    push<(moira::Size)4,0ul>(this,*(u32 *)((long)this->exec + uVar4 * 4 + -0x38));
    *(u32 *)((long)this->exec + uVar4 * 4 + -0x38) = addr;
    puVar1 = (this->reg).field_3.field_0.a + 7;
    *puVar1 = *puVar1 + (int)(short)uVar3;
    prefetch<4ul>(this);
    return;
  }
  *(u32 *)((long)this->exec + uVar4 * 4 + -0x38) = addr;
  uVar3 = (this->reg).pc;
  sr = getSR(this);
  frame = makeFrame<40ul>(this,addr,uVar3 + 2,sr,ird);
  execAddressError(this,frame,0);
  return;
}

Assistant:

void
Moira::execLink(u16 opcode)
{
    u16 ird  = getIRD();
    u32 sp   = getSP() - 4;
    
    int ax   = _____________xxx(opcode);
    i16 disp = (i16)readI<S>();

    // Check for address error
    if (misaligned<Long>(sp)) {
        writeA(ax, sp);
        execAddressError(makeFrame<AE_DATA|AE_WRITE>(sp, getPC() + 2, getSR(), ird));
        return;
    }
    
    // Write to stack
    push <Long> (readA(ax) - ((MIMIC_MUSASHI && ax == 7) ? 4 : 0));

    // Modify address register and stack pointer
    writeA(ax, sp);
    reg.sp += (i32)disp;

    prefetch<POLLIPL>();
}